

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O3

bool __thiscall kratos::XXHash64::add(XXHash64 *this,void *input,uint64_t length)

{
  uchar uVar1;
  long lVar2;
  bool bVar3;
  uint64_t *block;
  long *plVar4;
  uint64_t uVar5;
  uint uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  ulong uVar9;
  uint64_t uVar10;
  ulong uVar11;
  
  bVar3 = length != 0 && input != (void *)0x0;
  if (length != 0 && input != (void *)0x0) {
    this->totalLength = this->totalLength + length;
    uVar6 = this->bufferSize;
    uVar11 = (ulong)uVar6;
    if (0x1f < uVar11 + length) {
      plVar4 = (long *)input;
      if (uVar6 == 0) {
        uVar7 = this->state[0];
        uVar10 = this->state[1];
        uVar5 = this->state[2];
        uVar8 = this->state[3];
      }
      else {
        while (uVar6 < 0x20) {
          lVar2 = *plVar4;
          this->bufferSize = (int)uVar11 + 1;
          this->buffer[uVar11] = (uchar)lVar2;
          uVar6 = this->bufferSize;
          uVar11 = (ulong)uVar6;
          plVar4 = (long *)((long)plVar4 + 1);
        }
        uVar11 = *(long *)this->buffer * -0x3d4d51c2d82b14b1 + this->state[0];
        uVar7 = (uVar11 * 0x80000000 | uVar11 >> 0x21) * -0x61c8864e7a143579;
        this->state[0] = uVar7;
        uVar11 = *(long *)(this->buffer + 8) * -0x3d4d51c2d82b14b1 + this->state[1];
        uVar10 = (uVar11 * 0x80000000 | uVar11 >> 0x21) * -0x61c8864e7a143579;
        this->state[1] = uVar10;
        uVar11 = *(long *)(this->buffer + 0x10) * -0x3d4d51c2d82b14b1 + this->state[2];
        uVar5 = (uVar11 * 0x80000000 | uVar11 >> 0x21) * -0x61c8864e7a143579;
        this->state[2] = uVar5;
        uVar11 = *(long *)(this->buffer + 0x18) * -0x3d4d51c2d82b14b1 + this->state[3];
        uVar8 = (uVar11 * 0x80000000 | uVar11 >> 0x21) * -0x61c8864e7a143579;
        this->state[3] = uVar8;
      }
      for (; plVar4 <= (long *)((long)input + (length - 0x20)); plVar4 = plVar4 + 4) {
        uVar11 = *plVar4 * -0x3d4d51c2d82b14b1 + uVar7;
        uVar9 = plVar4[1] * -0x3d4d51c2d82b14b1 + uVar10;
        uVar7 = (uVar11 * 0x80000000 | uVar11 >> 0x21) * -0x61c8864e7a143579;
        uVar10 = (uVar9 * 0x80000000 | uVar9 >> 0x21) * -0x61c8864e7a143579;
        uVar9 = plVar4[2] * -0x3d4d51c2d82b14b1 + uVar5;
        uVar11 = plVar4[3] * -0x3d4d51c2d82b14b1 + uVar8;
        uVar5 = (uVar9 * 0x80000000 | uVar9 >> 0x21) * -0x61c8864e7a143579;
        uVar8 = (uVar11 * 0x80000000 | uVar11 >> 0x21) * -0x61c8864e7a143579;
      }
      this->state[0] = uVar7;
      this->state[1] = uVar10;
      this->state[2] = uVar5;
      this->state[3] = uVar8;
      uVar6 = ((int)input + (int)length) - (int)plVar4;
      this->bufferSize = uVar6;
      if (uVar6 != 0) {
        uVar11 = 0;
        do {
          this->buffer[uVar11] = *(uchar *)((long)plVar4 + uVar11);
          uVar11 = uVar11 + 1;
        } while (uVar11 < this->bufferSize);
      }
      return bVar3;
    }
    uVar7 = 0;
    do {
      uVar1 = *(uchar *)((long)input + uVar7);
      uVar6 = this->bufferSize;
      this->bufferSize = uVar6 + 1;
      this->buffer[uVar6] = uVar1;
      uVar7 = uVar7 + 1;
    } while (length != uVar7);
  }
  return bVar3;
}

Assistant:

bool add(const void* input, uint64_t length) {
        // no data ?
        if (!input || length == 0) return false;

        totalLength += length;
        // byte-wise access
        auto const* data = (const unsigned char*)input;

        // unprocessed old data plus new data still fit in temporary buffer ?
        if (bufferSize + length < MaxBufferSize) {
            // just add new data
            while (length-- > 0) buffer[bufferSize++] = *data++;
            return true;
        }

        // point beyond last byte
        const unsigned char* stop = data + length;
        const unsigned char* stopBlock = stop - MaxBufferSize;

        // some data left from previous update ?
        if (bufferSize > 0) {
            // make sure temporary buffer is full (16 bytes)
            while (bufferSize < MaxBufferSize) buffer[bufferSize++] = *data++;

            // process these 32 bytes (4x8)
            process(buffer, state[0], state[1], state[2], state[3]);
        }

        // copying state to local variables helps optimizer A LOT
        uint64_t s0 = state[0], s1 = state[1], s2 = state[2], s3 = state[3];
        // 32 bytes at once
        while (data <= stopBlock) {
            // local variables s0..s3 instead of state[0]..state[3] are much faster
            process(data, s0, s1, s2, s3);
            data += 32;
        }
        // copy back
        state[0] = s0;
        state[1] = s1;
        state[2] = s2;
        state[3] = s3;

        // copy remainder to temporary buffer
        bufferSize = stop - data;
        for (unsigned int i = 0; i < bufferSize; i++) buffer[i] = data[i];

        // done
        return true;
    }